

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O3

void setLLSMethod(reg_object obj,char *llsmethod)

{
  int iVar1;
  char *__s;
  
  if (((*llsmethod == 'q') && (llsmethod[1] == 'r')) && (llsmethod[2] == '\0')) {
    strcpy(obj->lls,llsmethod);
    return;
  }
  iVar1 = strcmp(llsmethod,"normal");
  if (iVar1 == 0) {
    strcpy(obj->lls,llsmethod);
    __s = 
    "Warning - This method will not calculate the rank of the regression. Use method qr instead. ";
  }
  else {
    iVar1 = strcmp(llsmethod,"svd");
    if (iVar1 != 0) {
      puts("This function only accepts one of three least square methods - ");
      puts(" qr, normal and svd. ");
      exit(-1);
    }
    strcpy(obj->lls,llsmethod);
    __s = 
    "Warning - This method will not calculate the rank of the regression. use method qr instead. ";
  }
  puts(__s);
  return;
}

Assistant:

void setLLSMethod(reg_object obj, char *llsmethod) {
	if (!strcmp(llsmethod, "qr")) {
		strcpy(obj->lls, llsmethod);
	}
	else if (!strcmp(llsmethod, "normal")) {
		strcpy(obj->lls, llsmethod);
		printf("Warning - This method will not calculate the rank of the regression. Use method qr instead. \n");
	}
	else if (!strcmp(llsmethod, "svd")) {
		strcpy(obj->lls, llsmethod);
		printf("Warning - This method will not calculate the rank of the regression. use method qr instead. \n");
	}
	else {
		printf("This function only accepts one of three least square methods - \n");
		printf(" qr, normal and svd. \n");
		exit(-1);
	}
}